

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.cc
# Opt level: O3

Exception * __thiscall
avro::json::JsonParser::unexpected(Exception *__return_storage_ptr__,JsonParser *this,uchar c)

{
  ostream *poVar1;
  byte bVar2;
  ostringstream oss;
  string local_1b0;
  undefined7 uStack_1af;
  long local_1a0 [2];
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Unexpected character in json ",0x1d);
  local_1b0 = (string)((c >> 4) + 0x57);
  if (c < 0xa0) {
    local_1b0 = (string)((c >> 4) + 0x30);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(char *)&local_1b0,1);
  bVar2 = c & 0xf;
  local_1b0 = (string)(bVar2 + 0x57);
  if (bVar2 < 10) {
    local_1b0 = (string)(bVar2 + 0x30);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1b0,1);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error((runtime_error *)&__return_storage_ptr__->field_0x8,&local_1b0);
  __return_storage_ptr__->_vptr_Exception = (_func_int **)0x17fa60;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = 0x17fa90;
  if ((long *)CONCAT71(uStack_1af,local_1b0) != local_1a0) {
    operator_delete((long *)CONCAT71(uStack_1af,local_1b0),local_1a0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

Exception JsonParser::unexpected(unsigned char c)
{
    std::ostringstream oss;
    oss << "Unexpected character in json " << toHex(c / 16) << toHex(c % 16);
    return Exception(oss.str());
}